

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O3

int nni_dialer_setopt(nni_dialer *d,char *name,void *val,size_t sz,nni_type t)

{
  _func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *p_Var1;
  nni_option *pnVar2;
  char *__s1;
  int iVar3;
  int iVar4;
  
  iVar3 = strcmp(name,"reconnect-time-max");
  if (iVar3 == 0) {
    nni_mtx_lock(&d->d_mtx);
    iVar3 = nni_copyin_ms(&d->d_maxrtime,val,sz,t);
    nni_mtx_unlock(&d->d_mtx);
  }
  else {
    iVar3 = strcmp(name,"reconnect-time-min");
    if (iVar3 == 0) {
      nni_mtx_lock(&d->d_mtx);
      iVar3 = nni_copyin_ms(&d->d_inirtime,val,sz,t);
      if (iVar3 == 0) {
        d->d_currtime = d->d_inirtime;
      }
      nni_mtx_unlock(&d->d_mtx);
    }
    else {
      p_Var1 = (d->d_ops).d_setopt;
      if ((p_Var1 == (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0) ||
         (iVar3 = (*p_Var1)(d->d_data,name,val,sz,t), iVar3 == 9)) {
        pnVar2 = (d->d_ops).d_options;
        iVar3 = 9;
        if (pnVar2 != (nni_option *)0x0) {
          __s1 = pnVar2->o_name;
          while (__s1 != (char *)0x0) {
            iVar4 = strcmp(__s1,name);
            if (iVar4 == 0) {
              if (pnVar2->o_set == (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
                return 0x18;
              }
              iVar3 = (*pnVar2->o_set)(d->d_data,val,sz,t);
              return iVar3;
            }
            __s1 = pnVar2[1].o_name;
            pnVar2 = pnVar2 + 1;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int
nni_dialer_setopt(
    nni_dialer *d, const char *name, const void *val, size_t sz, nni_type t)
{
	nni_option *o;

	if (strcmp(name, NNG_OPT_RECONNMAXT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyin_ms(&d->d_maxrtime, val, sz, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}
	if (strcmp(name, NNG_OPT_RECONNMINT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyin_ms(&d->d_inirtime, val, sz, t);
		if (rv == 0) {
			d->d_currtime = d->d_inirtime;
		}
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}

	if (d->d_ops.d_setopt != NULL) {
		int rv = d->d_ops.d_setopt(d->d_data, name, val, sz, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = d->d_ops.d_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_set == NULL) {
			return (NNG_EREADONLY);
		}

		return (o->o_set(d->d_data, val, sz, t));
	}

	return (NNG_ENOTSUP);
}